

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer.cpp
# Opt level: O0

int __thiscall infoPageAnalyzer::getTotalPageNumber(infoPageAnalyzer *this)

{
  int iVar1;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  pointer local_10;
  infoPageAnalyzer *this_local;
  
  local_10 = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Length",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  pageAnalyzer::getInfoFromContent
            ((pageAnalyzer *)&stack0xffffffffffffffd0,(string *)this,(int)local_50,4,(string *)0x12,
             (char)local_88);
  iVar1 = std::__cxx11::stoi((string *)&stack0xffffffffffffffd0,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return iVar1;
}

Assistant:

int infoPageAnalyzer::getTotalPageNumber()
{
    return stoi(this->getInfoFromContent(std::string("Length"), 4, GETMODE_PART, std::string(""), ' '));
}